

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O3

void __thiscall Thread::Thread(Thread *this,Json *json)

{
  string *this_00;
  string *this_01;
  const_reference pvVar1;
  ulong uVar2;
  long *plVar3;
  size_type *psVar4;
  string local_e0;
  Json *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string *local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_a0 = &(this->id).field_2;
  (this->id)._M_dataplus._M_p = (pointer)local_a0;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  this_00 = &this->selftext;
  local_a8 = &(this->selftext).field_2;
  (this->selftext)._M_dataplus._M_p = (pointer)local_a8;
  (this->selftext)._M_string_length = 0;
  (this->selftext).field_2._M_local_buf[0] = '\0';
  this_01 = &this->title;
  local_b0 = &(this->title).field_2;
  (this->title)._M_dataplus._M_p = (pointer)local_b0;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  local_98 = (string *)&this->link;
  local_b8 = &(this->link).field_2;
  (this->link)._M_dataplus._M_p = (pointer)local_b8;
  (this->link)._M_string_length = 0;
  (this->link).field_2._M_local_buf[0] = '\0';
  local_c0 = json;
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)json,"id");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_e0,pvVar1);
  std::__cxx11::string::operator=((string *)this,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_c0,"selftext");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_50,pvVar1);
  replaceHtmlSymbols(&local_e0,&local_50);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  for (uVar2 = std::__cxx11::string::find((char *)this_00,0x175e43,0); uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find((char *)this_00,0x175e43,uVar2 + 1)) {
    std::__cxx11::string::replace((ulong)this_00,uVar2,(char *)0x2,0x175ec8);
  }
  pvVar1 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_c0,"title");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_70,pvVar1);
  replaceHtmlSymbols(&local_e0,&local_70);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  for (uVar2 = std::__cxx11::string::find((char *)this_01,0x175e43,0); uVar2 != 0xffffffffffffffff;
      uVar2 = std::__cxx11::string::find((char *)this_01,0x175e43,uVar2 + 1)) {
    std::__cxx11::string::replace((ulong)this_01,uVar2,(char *)0x2,0x175ec8);
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::operator[]<char_const>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)local_c0,"permalink");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (local_90);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x175e4c);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_e0.field_2._M_allocated_capacity = *psVar4;
    local_e0.field_2._8_8_ = plVar3[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar4;
    local_e0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_e0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=(local_98,(string *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

Thread(const Json& json) {
			id = json["id"].get<std::string>();

			selftext = replaceHtmlSymbols(json["selftext"].get<std::string>());
			str::replace_all(selftext, "\\_", "_");

			title = replaceHtmlSymbols(json["title"].get<std::string>());
			str::replace_all(title, "\\_", "_");

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();
		}